

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

unique_ptr<char[],_std::default_delete<char[]>_> __thiscall
QUtil::make_unique_cstr(QUtil *this,string *str)

{
  std::make_unique<char[]>((size_t)this);
  *(undefined1 *)(*(long *)this + str->_M_string_length) = 0;
  memcpy(*(void **)this,(str->_M_dataplus)._M_p,str->_M_string_length);
  return (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<char[]>
QUtil::make_unique_cstr(std::string const& str)
{
    auto result = std::make_unique<char[]>(str.length() + 1);
    // Use memcpy in case string contains nulls
    result.get()[str.length()] = '\0';
    memcpy(result.get(), str.c_str(), str.length());
    return result;
}